

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O0

Value n2v(double num)

{
  anon_union_8_2_43acf83c convert;
  double num_local;
  
  return (Value)num;
}

Assistant:

static inline Value n2v(double num) {
	// Use a union to perform to bitwise conversion
	union {
		double num;
		Value val;
	} convert;
	convert.num = num;
	return convert.val;
}